

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlsbench.c
# Opt level: O3

uint64_t bench_time(void)

{
  int iVar1;
  uint64_t uVar2;
  timespec cpu;
  timeval tv;
  timespec local_28;
  timeval local_18;
  
  iVar1 = clock_gettime(2,&local_28);
  if (iVar1 == 0) {
    uVar2 = local_28.tv_sec * 1000000 + (ulong)local_28.tv_nsec / 1000;
  }
  else {
    gettimeofday(&local_18,(__timezone_ptr_t)0x0);
    uVar2 = local_18.tv_sec * 1000000 + local_18.tv_usec;
  }
  return uVar2;
}

Assistant:

static uint64_t bench_time()
{
    struct timeval tv;
#ifdef CLOCK_PROCESS_CPUTIME_ID
    struct timespec cpu;
    if (clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &cpu) == 0){
        uint64_t nanos = (uint64_t) cpu.tv_nsec;
        uint64_t micros = nanos/1000;
        micros += (1000000ull)*((uint64_t)cpu.tv_sec);
        return micros;
    }
#endif
    gettimeofday(&tv, NULL);
    return (uint64_t)tv.tv_sec * 1000000 + tv.tv_usec;
}